

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

double llvm::detail::scalbn(double __x,int __n)

{
  type pAVar1;
  long *in_RSI;
  undefined4 in_register_0000003c;
  DoubleAPFloat *this;
  double __x_00;
  double __x_01;
  double extraout_XMM0_Qa;
  APFloat local_a0;
  APFloat local_80;
  APFloat local_60;
  APFloat local_40;
  roundingMode RM_local;
  int Exp_local;
  DoubleAPFloat *Arg_local;
  
  this = (DoubleAPFloat *)CONCAT44(in_register_0000003c,__n);
  Arg_local = this;
  if ((undefined1 *)*in_RSI != semPPCDoubleDouble) {
    __assert_fail("Arg.Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x112e,
                  "DoubleAPFloat llvm::detail::scalbn(DoubleAPFloat, int, APFloat::roundingMode)");
  }
  pAVar1 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                     ((unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_> *)
                      (in_RSI + 1),0);
  APFloat::APFloat(&local_60,pAVar1);
  llvm::scalbn(__x_00,(int)&local_40);
  pAVar1 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                     ((unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_> *)
                      (in_RSI + 1),1);
  APFloat::APFloat(&local_a0,pAVar1);
  llvm::scalbn(__x_01,(int)&local_80);
  DoubleAPFloat::DoubleAPFloat(this,(fltSemantics *)semPPCDoubleDouble,&local_40,&local_80);
  APFloat::~APFloat(&local_80);
  APFloat::~APFloat(&local_a0);
  APFloat::~APFloat(&local_40);
  APFloat::~APFloat(&local_60);
  return extraout_XMM0_Qa;
}

Assistant:

DoubleAPFloat scalbn(DoubleAPFloat Arg, int Exp, APFloat::roundingMode RM) {
  assert(Arg.Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  return DoubleAPFloat(semPPCDoubleDouble, scalbn(Arg.Floats[0], Exp, RM),
                       scalbn(Arg.Floats[1], Exp, RM));
}